

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<5,_0,_5,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  long lVar1;
  float afStack_2c [5];
  int aiStack_18 [6];
  
  afStack_2c[2] = (float)s_constInMat2;
  afStack_2c[3] = (float)DAT_0224ba58;
  afStack_2c[4] = DAT_0224ba54 + DAT_0224ba5c;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = afStack_2c[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}